

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
::find_or_prepare_insert_non_soo<std::vector<int,std::allocator<int>>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
          *this,vector<int,_std::allocator<int>_> *key)

{
  char *pcVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  undefined8 uVar16;
  undefined1 uVar17;
  bool bVar18;
  ushort uVar19;
  uint uVar20;
  uint64_t uVar21;
  size_t sVar22;
  ulong uVar23;
  ctrl_t *pcVar24;
  long lVar25;
  anon_union_8_1_a8a14541_for_iterator_2 aVar26;
  bool bVar27;
  PolicyFunctions *in_R9;
  ulong uVar28;
  CommonFields *common;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  FindInfo target;
  __m128i match;
  ulong local_98;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cVar29;
  char cVar32;
  char cVar33;
  char cVar34;
  
  piVar2 = (key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar21 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,piVar2,
                      (long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar2);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar28 = ((long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 ^ uVar21) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 | (uVar28 & 0xff0000000000) >> 0x18
            | (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
            (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
  uVar4 = *(ulong *)(this + 0x10);
  uVar23 = ((ulong)common >> 7 ^ uVar4 >> 0xc) & uVar3;
  uVar17 = (undefined1)(uVar28 >> 0x38);
  auVar30 = ZEXT216(CONCAT11(uVar17,uVar17) & 0x7f7f);
  auVar30 = pshuflw(auVar30,auVar30,0);
  pcVar24 = (__return_storage_ptr__->first).ctrl_;
  aVar26 = (__return_storage_ptr__->first).field_1;
  bVar27 = __return_storage_ptr__->second;
  local_98 = 0;
  do {
    pcVar1 = (char *)(uVar4 + uVar23);
    local_78 = *pcVar1;
    cStack_77 = pcVar1[1];
    cStack_76 = pcVar1[2];
    cStack_75 = pcVar1[3];
    cStack_74 = pcVar1[4];
    cStack_73 = pcVar1[5];
    cStack_72 = pcVar1[6];
    cStack_71 = pcVar1[7];
    uVar16 = *(undefined8 *)pcVar1;
    cVar8 = pcVar1[8];
    cVar9 = pcVar1[9];
    cVar10 = pcVar1[10];
    cVar11 = pcVar1[0xb];
    cVar12 = pcVar1[0xc];
    cVar13 = pcVar1[0xd];
    cVar14 = pcVar1[0xe];
    cVar15 = pcVar1[0xf];
    cVar29 = auVar30[0];
    auVar31[0] = -(cVar29 == local_78);
    cVar32 = auVar30[1];
    auVar31[1] = -(cVar32 == cStack_77);
    cVar33 = auVar30[2];
    auVar31[2] = -(cVar33 == cStack_76);
    cVar34 = auVar30[3];
    auVar31[3] = -(cVar34 == cStack_75);
    auVar31[4] = -(cVar29 == cStack_74);
    auVar31[5] = -(cVar32 == cStack_73);
    auVar31[6] = -(cVar33 == cStack_72);
    auVar31[7] = -(cVar34 == cStack_71);
    auVar31[8] = -(cVar29 == cVar8);
    auVar31[9] = -(cVar32 == cVar9);
    auVar31[10] = -(cVar33 == cVar10);
    auVar31[0xb] = -(cVar34 == cVar11);
    auVar31[0xc] = -(cVar29 == cVar12);
    auVar31[0xd] = -(cVar32 == cVar13);
    auVar31[0xe] = -(cVar33 == cVar14);
    auVar31[0xf] = -(cVar34 == cVar15);
    uVar19 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
    uVar20 = (uint)uVar19;
    while (uVar19 != 0) {
      uVar6 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar28 = uVar6 + uVar23 & uVar3;
      lVar25 = uVar28 * 0x30;
      bVar18 = std::equal_to<std::vector<int,_std::allocator<int>_>_>::operator()
                         ((equal_to<std::vector<int,_std::allocator<int>_>_> *)this,
                          (vector<int,_std::allocator<int>_> *)(*(long *)(this + 0x18) + lVar25),key
                         );
      if (bVar18) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar27;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        if (*(long *)(this + 0x10) != 0) {
          lVar5 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar28);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar25 + lVar5);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_0019ee29;
      }
      uVar19 = (ushort)(uVar20 - 1) & (ushort)uVar20;
      uVar20 = CONCAT22((short)(uVar20 - 1 >> 0x10),uVar19);
      local_78 = (char)uVar16;
      cStack_77 = (char)((ulong)uVar16 >> 8);
      cStack_76 = (char)((ulong)uVar16 >> 0x10);
      cStack_75 = (char)((ulong)uVar16 >> 0x18);
      cStack_74 = (char)((ulong)uVar16 >> 0x20);
      cStack_73 = (char)((ulong)uVar16 >> 0x28);
      cStack_72 = (char)((ulong)uVar16 >> 0x30);
      cStack_71 = (char)((ulong)uVar16 >> 0x38);
    }
    auVar35[0] = -(local_78 == -0x80);
    auVar35[1] = -(cStack_77 == -0x80);
    auVar35[2] = -(cStack_76 == -0x80);
    auVar35[3] = -(cStack_75 == -0x80);
    auVar35[4] = -(cStack_74 == -0x80);
    auVar35[5] = -(cStack_73 == -0x80);
    auVar35[6] = -(cStack_72 == -0x80);
    auVar35[7] = -(cStack_71 == -0x80);
    auVar35[8] = -(cVar8 == -0x80);
    auVar35[9] = -(cVar9 == -0x80);
    auVar35[10] = -(cVar10 == -0x80);
    auVar35[0xb] = -(cVar11 == -0x80);
    auVar35[0xc] = -(cVar12 == -0x80);
    auVar35[0xd] = -(cVar13 == -0x80);
    auVar35[0xe] = -(cVar14 == -0x80);
    auVar35[0xf] = -(cVar15 == -0x80);
    uVar19 = (ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe | (ushort)(auVar35[0xf] >> 7) << 0xf;
    if (uVar19 == 0) {
      if (*(ulong *)this < local_98 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar27;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, std::vector<int>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, std::vector<int>>>, K = std::vector<int>]"
                     );
      }
      uVar23 = uVar23 + local_98 + 0x10 & uVar3;
      local_98 = local_98 + 0x10;
    }
    else {
      bVar18 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar18) {
        uVar7 = 0xf;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar20 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar20 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_98;
      sVar22 = PrepareInsertNonSoo((container_internal *)this,common,uVar20 + uVar23 & uVar3,target,
                                   in_R9);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar27;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
LAB_0019ee29:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, std::vector<int>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, std::vector<int>>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, std::vector<int>>>]"
                     );
      }
      pcVar24 = (ctrl_t *)(*(long *)(this + 0x10) + sVar22);
      aVar26.slot_ = (slot_type *)(sVar22 * 0x30 + *(long *)(this + 0x18));
      bVar27 = true;
    }
    if (uVar19 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar26;
      __return_storage_ptr__->second = bVar27;
      (__return_storage_ptr__->first).ctrl_ = pcVar24;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }